

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O2

longdouble * __thiscall
chaiscript::Boxed_Number::get_as<long_double>(longdouble *__return_storage_ptr__,Boxed_Number *this)

{
  Common_Types CVar1;
  longdouble *plVar2;
  undefined8 *puVar3;
  
  CVar1 = get_common_type((Boxed_Value *)__return_storage_ptr__);
  switch(CVar1) {
  case t_int32:
    plVar2 = (longdouble *)(ulong)**(uint **)(*(long *)__return_storage_ptr__ + 0x28);
    break;
  case t_double:
    plVar2 = *(longdouble **)(*(long *)__return_storage_ptr__ + 0x28);
    break;
  case t_uint8:
    plVar2 = (longdouble *)(ulong)**(byte **)(*(long *)__return_storage_ptr__ + 0x28);
    break;
  case t_int8:
    plVar2 = (longdouble *)(ulong)(uint)(int)**(char **)(*(long *)__return_storage_ptr__ + 0x28);
    break;
  case t_uint16:
    plVar2 = (longdouble *)(ulong)**(ushort **)(*(long *)__return_storage_ptr__ + 0x28);
    break;
  case t_int16:
    plVar2 = (longdouble *)(ulong)**(ushort **)(*(long *)__return_storage_ptr__ + 0x28);
    break;
  case t_uint32:
    plVar2 = (longdouble *)(ulong)**(uint **)(*(long *)__return_storage_ptr__ + 0x28);
    break;
  case t_uint64:
    plVar2 = (longdouble *)&DAT_003c1158;
    break;
  case t_int64:
    plVar2 = (longdouble *)**(undefined8 **)(*(long *)__return_storage_ptr__ + 0x28);
    break;
  case t_float:
    plVar2 = *(longdouble **)(*(long *)__return_storage_ptr__ + 0x28);
    break;
  case t_long_double:
    plVar2 = *(longdouble **)(*(long *)__return_storage_ptr__ + 0x28);
    break;
  default:
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = &PTR__bad_cast_00453578;
    __cxa_throw(puVar3,&detail::exception::bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
  }
  return plVar2;
}

Assistant:

Target get_as() const {
      switch (get_common_type(bv)) {
        case Common_Types::t_int32:
          return get_as_aux<Target, int32_t>(bv);
        case Common_Types::t_uint8:
          return get_as_aux<Target, uint8_t>(bv);
        case Common_Types::t_int8:
          return get_as_aux<Target, int8_t>(bv);
        case Common_Types::t_uint16:
          return get_as_aux<Target, uint16_t>(bv);
        case Common_Types::t_int16:
          return get_as_aux<Target, int16_t>(bv);
        case Common_Types::t_uint32:
          return get_as_aux<Target, uint32_t>(bv);
        case Common_Types::t_uint64:
          return get_as_aux<Target, uint64_t>(bv);
        case Common_Types::t_int64:
          return get_as_aux<Target, int64_t>(bv);
        case Common_Types::t_double:
          return get_as_aux<Target, double>(bv);
        case Common_Types::t_float:
          return get_as_aux<Target, float>(bv);
        case Common_Types::t_long_double:
          return get_as_aux<Target, long double>(bv);
      }

      throw chaiscript::detail::exception::bad_any_cast();
    }